

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O2

bool __thiscall chrono::ChShaft::TrySleeping(ChShaft *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  if (this->use_sleeping == true) {
    if (this->sleeping != false) {
      return true;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->pos_dt;
    auVar2._8_8_ = 0x7fffffffffffffff;
    auVar2._0_8_ = 0x7fffffffffffffff;
    auVar2 = vandpd_avx512vl(auVar3,auVar2);
    dVar1 = (this->super_ChPhysicsItem).super_ChObj.ChTime;
    if ((double)this->sleep_minspeed <= auVar2._0_8_) {
      this->sleep_starttime = (float)dVar1;
    }
    else if ((double)this->sleep_time < dVar1 - (double)this->sleep_starttime) {
      this->sleeping = true;
      return true;
    }
  }
  return false;
}

Assistant:

bool ChShaft::TrySleeping() {
    if (GetUseSleeping()) {
        if (GetSleeping())
            return true;

        if (fabs(pos_dt) < sleep_minspeed) {
            if ((GetChTime() - sleep_starttime) > sleep_time) {
                SetSleeping(true);
                return true;
            }
        } else {
            sleep_starttime = float(GetChTime());
        }
    }
    return false;
}